

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr *pPVar1;
  PgHdr *local_18;
  PgHdr *p;
  PCache *pCache_local;
  
  for (local_18 = pCache->pDirty; local_18 != (PgHdr *)0x0; local_18 = local_18->pDirtyNext) {
    local_18->pDirty = local_18->pDirtyNext;
  }
  pPVar1 = pcacheSortDirtyList(pCache->pDirty);
  return pPVar1;
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}